

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# addressOperations.cpp
# Opt level: O3

bool gmlc::networking::isIpv6(string *address)

{
  size_t __n;
  pointer __s;
  int iVar1;
  size_t sVar2;
  void *pvVar3;
  ulong uVar4;
  char *__data;
  
  __n = address->_M_string_length;
  if (__n != 0) {
    __s = (address->_M_dataplus)._M_p;
    sVar2 = 0;
    uVar4 = 0;
    do {
      uVar4 = uVar4 + (__s[sVar2] == ':');
      sVar2 = sVar2 + 1;
    } while (__n != sVar2);
    if (2 < uVar4) {
      return true;
    }
    pvVar3 = memchr(__s,0x5b,__n);
    if (pvVar3 != (void *)0x0 && (long)pvVar3 - (long)__s != -1) {
      return true;
    }
  }
  iVar1 = CLI::std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
          compare((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)address,0,2,
                  "::");
  return iVar1 == 0;
}

Assistant:

bool isIpv6(const std::string& address)
{
    auto cntcolon = std::count(address.begin(), address.end(), ':');
    if (cntcolon > 2) {
        return true;
    }

    auto brkcnt = address.find_first_of('[');
    if (brkcnt != std::string::npos) {
        return true;
    }
    if (address.compare(0, 2, "::") == 0) {
        return true;
    }
    return false;
}